

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong n;
  uint lo_00;
  ulong n_00;
  ulong uVar6;
  ulong local_40;
  
  local_40 = (ulong)lo;
  if (lo < up) {
    do {
      lo_00 = (uint)local_40;
      lua_geti(L,1,local_40);
      uVar4 = (ulong)up;
      lua_geti(L,1,uVar4);
      iVar1 = sort_comp(L,-1,-2);
      if (iVar1 == 0) {
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,local_40);
        lua_seti(L,1,uVar4);
      }
      uVar5 = up - lo_00;
      if (uVar5 == 1) {
        return;
      }
      if (rnd == 0 || uVar5 < 100) {
        uVar3 = lo_00 + up >> 1;
      }
      else {
        uVar3 = (uVar5 >> 2) + lo_00 + (up ^ lo_00 ^ rnd) % ((uVar5 >> 2) * 2);
      }
      n_00 = (ulong)uVar3;
      lua_geti(L,1,n_00);
      lua_geti(L,1,local_40);
      iVar1 = sort_comp(L,-2,-1);
      if (iVar1 == 0) {
        lua_settop(L,-2);
        lua_geti(L,1,uVar4);
        iVar1 = sort_comp(L,-1,-2);
        if (iVar1 != 0) {
          lua_seti(L,1,n_00);
          goto LAB_0011db3d;
        }
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,n_00);
        uVar4 = local_40;
LAB_0011db3d:
        lua_seti(L,1,uVar4);
      }
      if (uVar5 == 2) {
        return;
      }
      lua_geti(L,1,n_00);
      lua_pushvalue(L,-1);
      n = (ulong)(up - 1);
      lua_geti(L,1,n);
      uVar4 = n;
      uVar6 = local_40;
      do {
        lua_seti(L,1,n_00);
        lua_seti(L,1,uVar4);
        iVar1 = (int)uVar6;
        n_00 = (ulong)(iVar1 + 1);
        lua_geti(L,1,n_00);
        iVar2 = sort_comp(L,-1,-2);
        uVar6 = n_00;
        if (iVar2 != 0) {
          uVar5 = iVar1 + 2;
          do {
            uVar3 = uVar5;
            if (up == uVar3) {
              luaL_error(L,"invalid order function for sorting");
            }
            lua_settop(L,-2);
            n_00 = (ulong)uVar3;
            lua_geti(L,1,n_00);
            iVar1 = sort_comp(L,-1,-2);
            uVar5 = uVar3 + 1;
          } while (iVar1 != 0);
          uVar6 = (ulong)uVar3;
        }
        while( true ) {
          uVar5 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar5;
          lua_geti(L,1,uVar4);
          iVar1 = sort_comp(L,-3,-1);
          uVar3 = (uint)uVar6;
          if (iVar1 == 0) break;
          if (uVar5 < uVar3) {
            luaL_error(L,"invalid order function for sorting");
          }
          lua_settop(L,-2);
        }
      } while (uVar3 <= uVar5);
      lua_settop(L,-2);
      lua_seti(L,1,n);
      lua_seti(L,1,n_00);
      uVar5 = up - uVar3;
      if (uVar3 - lo_00 < uVar5) {
        auxsort(L,lo_00,uVar3 - 1,rnd);
        local_40 = (ulong)(uVar3 + 1);
        uVar5 = uVar3 - lo_00;
      }
      else {
        auxsort(L,uVar3 + 1,up,rnd);
        up = uVar3 - 1;
      }
      if (uVar5 < up - (uint)local_40 >> 7) {
        rnd = luaL_makeseed(L);
      }
    } while ((uint)local_40 < up);
  }
  return;
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up, unsigned rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    geti(L, 1, lo);
    geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    geti(L, 1, p);
    geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot(L);  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}